

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O3

void test_chain_operation<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>>
               (Matrix<Chain_barcode_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>
                *m)

{
  uint uVar1;
  uint uVar2;
  Dimension DVar3;
  uint uVar4;
  Dimension DVar5;
  pointer pIVar6;
  pointer puVar7;
  bool bVar8;
  uint __tmp;
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  columns;
  anon_class_1_0_00000001 local_6b;
  anon_class_1_0_00000001 local_6a;
  anon_class_1_0_00000001 local_69;
  anon_class_8_1_e4bd5e45 local_68;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined8 local_58;
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  local_48;
  anon_class_8_1_e4bd5e45 local_30;
  
  build_simple_chain_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>>>
            ();
  test_content_equality<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>>
            (&local_48,m);
  pIVar6 = (m->matrix_).matrix_.
           super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_68.targetColumn = pIVar6 + 5;
  uVar1 = pIVar6[5].super_Chain_column_option.pivot_;
  local_30.targetColumn = local_68.targetColumn;
  bVar8 = Gudhi::persistence_matrix::
          _generic_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>>,Gudhi::persistence_matrix::_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>>>(Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>>const&,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::pe___se,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>__Matrix_column_tag_1u>_false>___1_>
                    (pIVar6 + 3,local_68.targetColumn,&local_6a,&local_68,&local_30,&local_6b,
                     &local_69);
  uVar2 = pIVar6[5].super_Chain_column_option.pivot_;
  uVar4 = uVar2;
  if (bVar8) {
    DVar3 = pIVar6[3].super_Column_dimension_option.dim_;
    uVar4 = pIVar6[3].super_Chain_column_option.pivot_;
    pIVar6[5].super_Chain_column_option.pivot_ = uVar4;
    pIVar6[3].super_Chain_column_option.pivot_ = uVar2;
    DVar5 = pIVar6[5].super_Column_dimension_option.dim_;
    pIVar6[5].super_Column_dimension_option.dim_ = DVar3;
    pIVar6[3].super_Column_dimension_option.dim_ = DVar5;
  }
  if (uVar1 != uVar4) {
    puVar7 = (m->matrix_).pivotToColumnIndex_.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar2 = puVar7[uVar1];
    puVar7[uVar1] = puVar7[uVar4];
    puVar7[uVar4] = uVar2;
  }
  local_68.targetColumn =
       (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>
        *)0x200000003;
  uStack_60 = 4;
  uStack_5c = 1;
  local_58 = 0x400000005;
  std::
  vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
  ::_M_assign_aux<std::pair<unsigned_int,unsigned_int>const*>
            ((vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
              *)(local_48.
                 super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 5),&local_68);
  test_content_equality<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>>
            (&local_48,m);
  pIVar6 = (m->matrix_).matrix_.
           super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_68.targetColumn = pIVar6 + 5;
  uVar1 = pIVar6[5].super_Chain_column_option.pivot_;
  local_30.targetColumn = local_68.targetColumn;
  bVar8 = Gudhi::persistence_matrix::
          _generic_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>>,Gudhi::persistence_matrix::_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>>>(Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>>const&,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::pe___se,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>__Matrix_column_tag_1u>_false>___1_>
                    (pIVar6 + 4,local_68.targetColumn,&local_6a,&local_68,&local_30,&local_6b,
                     &local_69);
  uVar2 = pIVar6[5].super_Chain_column_option.pivot_;
  uVar4 = uVar2;
  if (bVar8) {
    DVar3 = pIVar6[4].super_Column_dimension_option.dim_;
    uVar4 = pIVar6[4].super_Chain_column_option.pivot_;
    pIVar6[5].super_Chain_column_option.pivot_ = uVar4;
    pIVar6[4].super_Chain_column_option.pivot_ = uVar2;
    DVar5 = pIVar6[5].super_Column_dimension_option.dim_;
    pIVar6[5].super_Column_dimension_option.dim_ = DVar3;
    pIVar6[4].super_Column_dimension_option.dim_ = DVar5;
  }
  if (uVar1 != uVar4) {
    puVar7 = (m->matrix_).pivotToColumnIndex_.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar2 = puVar7[uVar1];
    puVar7[uVar1] = puVar7[uVar4];
    puVar7[uVar4] = uVar2;
  }
  local_68.targetColumn._0_4_ = 3;
  local_68.targetColumn._4_4_ = 3;
  uStack_60 = 4;
  uStack_5c = 2;
  local_58 = 0x400000005;
  std::
  vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
  ::_M_assign_aux<std::pair<unsigned_int,unsigned_int>const*>
            ((vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
              *)(local_48.
                 super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 5),&local_68);
  test_content_equality<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>>
            (&local_48,m);
  uVar1 = (m->colSettings_->operators).characteristic_;
  local_68.targetColumn._0_4_ = 3;
  if ((int)uVar1 < 4) {
    local_68.targetColumn._0_4_ = (undefined4)(3 % (ulong)uVar1);
  }
  pIVar6 = (m->matrix_).matrix_.
           super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar1 = pIVar6[3].super_Chain_column_option.pivot_;
  bVar8 = Gudhi::persistence_matrix::
          _multiply_target_and_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>>>
                    ((Field_element *)&local_68,pIVar6 + 5,pIVar6 + 3);
  uVar2 = pIVar6[3].super_Chain_column_option.pivot_;
  uVar4 = uVar2;
  if (bVar8) {
    uVar4 = pIVar6[5].super_Chain_column_option.pivot_;
    pIVar6[3].super_Chain_column_option.pivot_ = uVar4;
    pIVar6[5].super_Chain_column_option.pivot_ = uVar2;
    DVar3 = pIVar6[3].super_Column_dimension_option.dim_;
    pIVar6[3].super_Column_dimension_option.dim_ = pIVar6[5].super_Column_dimension_option.dim_;
    pIVar6[5].super_Column_dimension_option.dim_ = DVar3;
  }
  if (uVar1 != uVar4) {
    puVar7 = (m->matrix_).pivotToColumnIndex_.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar2 = puVar7[uVar1];
    puVar7[uVar1] = puVar7[uVar4];
    puVar7[uVar4] = uVar2;
  }
  local_68.targetColumn._0_4_ = 3;
  local_68.targetColumn._4_4_ = 1;
  uStack_60 = 4;
  uStack_5c = 2;
  local_58 = 0x400000005;
  std::
  vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
  ::_M_assign_aux<std::pair<unsigned_int,unsigned_int>const*>
            ((vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
              *)(local_48.
                 super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 3),&local_68);
  test_content_equality<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>>
            (&local_48,m);
  uVar1 = (m->colSettings_->operators).characteristic_;
  local_68.targetColumn._0_4_ = 4;
  if ((int)uVar1 < 5) {
    local_68.targetColumn._0_4_ = (undefined4)(4 % (ulong)uVar1);
  }
  pIVar6 = (m->matrix_).matrix_.
           super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar1 = pIVar6[4].super_Chain_column_option.pivot_;
  bVar8 = Gudhi::persistence_matrix::
          _multiply_source_and_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>>>
                    ((Field_element *)&local_68,pIVar6 + 5,pIVar6 + 4);
  uVar2 = pIVar6[4].super_Chain_column_option.pivot_;
  uVar4 = uVar2;
  if (bVar8) {
    uVar4 = pIVar6[5].super_Chain_column_option.pivot_;
    pIVar6[4].super_Chain_column_option.pivot_ = uVar4;
    pIVar6[5].super_Chain_column_option.pivot_ = uVar2;
    DVar3 = pIVar6[4].super_Column_dimension_option.dim_;
    pIVar6[4].super_Column_dimension_option.dim_ = pIVar6[5].super_Column_dimension_option.dim_;
    pIVar6[5].super_Column_dimension_option.dim_ = DVar3;
  }
  if (uVar1 != uVar4) {
    puVar7 = (m->matrix_).pivotToColumnIndex_.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar2 = puVar7[uVar1];
    puVar7[uVar1] = puVar7[uVar4];
    puVar7[uVar4] = uVar2;
  }
  local_68.targetColumn =
       (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>_>
        *)0x300000003;
  uStack_60 = 4;
  uStack_5c = 4;
  local_58 = 0x100000005;
  std::
  vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
  ::_M_assign_aux<std::pair<unsigned_int,unsigned_int>const*>
            ((vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
              *)(local_48.
                 super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 4),&local_68);
  test_content_equality<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>>
            (&local_48,m);
  std::
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ::~vector(&local_48);
  return;
}

Assistant:

void test_chain_operation(Matrix& m) {
  auto columns = build_simple_chain_matrix<typename Matrix::Column>();

  test_content_equality(columns, m);

  m.add_to(3, 5);
  if constexpr (Matrix::Option_list::is_z2) {
    columns[5] = {4, 5};
  } else {
    columns[5] = {{3, 2}, {4, 1}, {5, 4}};
  }
  test_content_equality(columns, m);

  m.add_to(4, 5);
  if constexpr (Matrix::Option_list::is_z2) {
    columns[5] = {3, 5};
  } else {
    columns[5] = {{3, 3}, {4, 2}, {5, 4}};
  }
  test_content_equality(columns, m);

  m.multiply_target_and_add_to(5, 3, 3);
  if constexpr (Matrix::Option_list::is_z2) {
    columns[3] = {5};
  } else {
    columns[3] = {{3, 1}, {4, 2}, {5, 4}};
  }
  test_content_equality(columns, m);

  m.multiply_source_and_add_to(4, 5, 4);
  if constexpr (Matrix::Option_list::is_z2) {
    columns[4] = {3, 4};
  } else {
    columns[4] = {{3, 3}, {4, 4}, {5, 1}};
  }
  test_content_equality(columns, m);
}